

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O0

void __thiscall DSeqActorNode::Destroy(DSeqActorNode *this)

{
  AActor *actor;
  FSoundID local_14;
  DSeqActorNode *local_10;
  DSeqActorNode *this_local;
  
  local_10 = this;
  if (-1 < (this->super_DSeqNode).m_StopSound) {
    actor = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->m_Actor);
    S_StopSound(actor,4);
  }
  if (0 < (this->super_DSeqNode).m_StopSound) {
    FSoundID::FSoundID(&local_14,(this->super_DSeqNode).m_StopSound);
    (*(this->super_DSeqNode).super_DObject._vptr_DObject[7])(this,0,&local_14);
  }
  DSeqNode::Destroy(&this->super_DSeqNode);
  return;
}

Assistant:

void DSeqActorNode::Destroy ()
{
	if (m_StopSound >= 0)
		S_StopSound (m_Actor, CHAN_BODY);
	if (m_StopSound >= 1)
		MakeSound (0, m_StopSound);
	Super::Destroy();
}